

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeSetPageSize(Btree *p,int pageSize,int nReserve,int iFix)

{
  int *piVar1;
  BtShared *pBVar2;
  sqlite3_mutex *psVar3;
  int iVar4;
  
  pBVar2 = p->pBt;
  sqlite3BtreeEnter(p);
  if ((pBVar2->btsFlags & 2) == 0) {
    if (nReserve < 0) {
      nReserve = pBVar2->pageSize - pBVar2->usableSize;
    }
    if ((pageSize - 0x200U < 0xfe01) && ((pageSize + 0x1ffffU & pageSize) == 0)) {
      pBVar2->pageSize = pageSize;
      pcache1Free(pBVar2->pTmpSpace);
      pBVar2->pTmpSpace = (u8 *)0x0;
    }
    iVar4 = sqlite3PagerSetPagesize(pBVar2->pPager,&pBVar2->pageSize,nReserve);
    pBVar2->usableSize = pBVar2->pageSize - (nReserve & 0xffffU);
    if (iFix != 0) {
      *(byte *)&pBVar2->btsFlags = (byte)pBVar2->btsFlags | 2;
    }
  }
  else {
    iVar4 = 8;
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      psVar3 = p->pBt->mutex;
      if (psVar3 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar3);
      }
      p->locked = '\0';
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPageSize(Btree *p, int pageSize, int nReserve, int iFix){
  int rc = SQLITE_OK;
  BtShared *pBt = p->pBt;
  assert( nReserve>=-1 && nReserve<=255 );
  sqlite3BtreeEnter(p);
  if( pBt->btsFlags & BTS_PAGESIZE_FIXED ){
    sqlite3BtreeLeave(p);
    return SQLITE_READONLY;
  }
  if( nReserve<0 ){
    nReserve = pBt->pageSize - pBt->usableSize;
  }
  assert( nReserve>=0 && nReserve<=255 );
  if( pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE &&
        ((pageSize-1)&pageSize)==0 ){
    assert( (pageSize & 7)==0 );
    assert( !pBt->pPage1 && !pBt->pCursor );
    pBt->pageSize = (u32)pageSize;
    freeTempSpace(pBt);
  }
  rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
  pBt->usableSize = pBt->pageSize - (u16)nReserve;
  if( iFix ) pBt->btsFlags |= BTS_PAGESIZE_FIXED;
  sqlite3BtreeLeave(p);
  return rc;
}